

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferOperationsViaImageStore::initializeBufferObjectData
          (TextureBufferOperationsViaImageStore *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *local_40;
  char *csCode;
  string csSource;
  Functions *gl;
  TextureBufferOperationsViaImageStore *this_local;
  
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_TextureBufferOperations).super_TestCaseBase.m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  csSource.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(csSource.field_2._8_8_ + 0x3c8))();
  this->m_is_po_id = GVar3;
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x555);
  GVar3 = (**(code **)(csSource.field_2._8_8_ + 0x3f0))(0x91b9);
  this->m_is_cs_id = GVar3;
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error creating compute shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x558);
  getISComputeShaderCode_abi_cxx11_((string *)&csCode,this);
  local_40 = (char *)std::__cxx11::string::c_str();
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,this->m_is_po_id,this->m_is_cs_id,1,&local_40,(bool *)0x0)
  ;
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not create a program from valid compute shader source!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
               ,0x55f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(csSource.field_2._8_8_ + 0x1680))(this->m_is_po_id);
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x563);
  (**(code **)(csSource.field_2._8_8_ + 0x80))
            (0,(this->super_TextureBufferOperations).m_texbuff_id,0,0,0,0x88b9,0x8d82);
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error binding texture object to image unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x566);
  (**(code **)(csSource.field_2._8_8_ + 0x528))(1,1);
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error running compute shader!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x569);
  (**(code **)(csSource.field_2._8_8_ + 0xdb8))(8);
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error setting memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x56c);
  (**(code **)(csSource.field_2._8_8_ + 0x1680))(0);
  std::__cxx11::string::~string((string *)&csCode);
  return;
}

Assistant:

void TextureBufferOperationsViaImageStore::initializeBufferObjectData()
{
	/* Get Gl entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Configure program object */
	m_is_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_is_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating compute shader object!");

	std::string csSource = getISComputeShaderCode();
	const char* csCode   = csSource.c_str();

	if (!buildProgram(m_is_po_id, m_is_cs_id, 1, &csCode))
	{
		TCU_FAIL("Could not create a program from valid compute shader source!");
	}

	gl.useProgram(m_is_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	gl.bindImageTexture(m_image_unit, m_texbuff_id, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32I);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error running compute shader!");

	gl.memoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

	gl.useProgram(0);
}